

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O3

uint rtcAttachGeometry(RTCScene hscene,RTCGeometry hgeometry)

{
  uint uVar1;
  undefined8 *puVar2;
  socklen_t in_ECX;
  DeviceEnterLeave enterleave;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  RTCGeometry local_40;
  DeviceEnterLeave local_38;
  
  if (hscene == (RTCScene)0x0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"invalid argument","");
    *puVar2 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar2 + 1) = 2;
    puVar2[2] = puVar2 + 4;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 2),local_60,local_60 + local_58);
    __cxa_throw(puVar2,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
  }
  if (hgeometry != (RTCGeometry)0x0) {
    embree::DeviceEnterLeave::DeviceEnterLeave(&local_38,hgeometry);
    if (*(long *)(hscene + 0x188) == *(long *)(hgeometry + 0x10)) {
      local_40 = hgeometry;
      (**(code **)(*(long *)hgeometry + 0x10))(hgeometry);
      uVar1 = embree::Scene::bind((Scene *)hscene,-1,(sockaddr *)&local_40,in_ECX);
      if (local_40 != (RTCGeometry)0x0) {
        (**(code **)(*(long *)local_40 + 0x18))();
      }
      embree::DeviceEnterLeave::~DeviceEnterLeave(&local_38);
      return uVar1;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"inputs are from different devices","");
    *puVar2 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar2 + 1) = 2;
    puVar2[2] = puVar2 + 4;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 2),local_60,local_60 + local_58);
    __cxa_throw(puVar2,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"invalid argument","");
  *puVar2 = &PTR__rtcore_error_02184a18;
  *(undefined4 *)(puVar2 + 1) = 2;
  puVar2[2] = puVar2 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 2),local_60,local_60 + local_58);
  __cxa_throw(puVar2,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API unsigned int rtcAttachGeometry (RTCScene hscene, RTCGeometry hgeometry)
  {
    Scene* scene = (Scene*) hscene;
    Geometry* geometry = (Geometry*) hgeometry;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcAttachGeometry);
    RTC_VERIFY_HANDLE(hscene);
    RTC_VERIFY_HANDLE(hgeometry);
    RTC_ENTER_DEVICE(hgeometry);
    if (scene->device != geometry->device)
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"inputs are from different devices");
    return scene->bind(RTC_INVALID_GEOMETRY_ID,geometry);
    RTC_CATCH_END2(scene);
    return -1;
  }